

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O3

string * __thiscall
FIX::HttpMessage::toString_abi_cxx11_(string *__return_storage_ptr__,HttpMessage *this)

{
  string str;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  toString(this,&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_30._M_dataplus._M_p,
             local_30._M_dataplus._M_p + local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpMessage::toString() const
{
  std::string str;
  return toString( str );
}